

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall QMdiArea::showEvent(QMdiArea *this,QShowEvent *showEvent)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QArrayData *pQVar2;
  Rearranger **ppRVar3;
  Rearranger *rearranger;
  Data *pDVar4;
  QWidget *this_01;
  QWidgetData *pQVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  undefined8 uVar9;
  QWidget *pQVar10;
  QSize QVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  QPointer<QMdiSubWindow> *pQVar15;
  QPointer<QMdiSubWindow> *pQVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QSize local_58;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->pendingRearrangements).d.size;
  if (lVar1 != 0) {
    pQVar2 = &((this_00->pendingRearrangements).d.d)->super_QArrayData;
    ppRVar3 = (this_00->pendingRearrangements).d.ptr;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar17 = 0;
    bVar7 = false;
    do {
      rearranger = *(Rearranger **)((long)ppRVar3 + lVar17);
      iVar8 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      bVar6 = true;
      if (bVar7) {
        bVar6 = bVar7;
      }
      if (iVar8 == 2) {
        bVar6 = bVar7;
      }
      QMdiAreaPrivate::rearrange(this_00,rearranger);
      lVar17 = lVar17 + 8;
      bVar7 = bVar6;
    } while (lVar1 << 3 != lVar17);
    QList<QMdi::Rearranger_*>::clear(&this_00->pendingRearrangements);
    if ((bVar6) && ((this_00->pendingPlacements).d.size != 0)) {
      QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
    }
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,8,0x10);
      }
    }
  }
  lVar1 = (this_00->pendingPlacements).d.size;
  if (lVar1 == 0) goto LAB_00442f7a;
  local_50.d = (this_00->pendingPlacements).d.d;
  pQVar15 = (this_00->pendingPlacements).d.ptr;
  local_50.ptr = pQVar15;
  local_50.size = lVar1;
  if (local_50.d == (Data *)0x0) {
LAB_00442e16:
    pQVar16 = pQVar15 + lVar1;
    do {
      pDVar4 = (pQVar15->wp).d;
      if (((pDVar4 != (Data *)0x0) && (*(int *)(pDVar4 + 4) != 0)) &&
         (this_01 = (QWidget *)(pQVar15->wp).value, this_01 != (QWidget *)0x0)) {
        if (((this_00->viewMode == TabbedView) &&
            (*(char *)(*(long *)&this_01->field_0x8 + 0x2db) == '\x01')) &&
           ((pDVar4 = (this_00->active).wp.d, pDVar4 == (Data *)0x0 ||
            ((*(int *)(pDVar4 + 4) == 0 || ((this_00->active).wp.value == (QObject *)0x0)))))) {
          this_00->showActiveWindowMaximized = true;
          QMdiAreaPrivate::emitWindowActivated(this_00,(QMdiSubWindow *)this_01);
        }
        else {
          bVar7 = QWidget::testAttribute_helper(this_01,WA_Resized);
          if (!bVar7) {
            uVar9 = (**(code **)(*(long *)this_01 + 0x70))(this_01);
            pQVar10 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            pQVar5 = pQVar10->data;
            uVar12 = ((pQVar5->crect).x2.m_i - (pQVar5->crect).x1.m_i) + 1;
            uVar18 = (uint)uVar9;
            if ((int)uVar12 <= (int)(uint)uVar9) {
              uVar18 = uVar12;
            }
            uVar13 = ((pQVar5->crect).y2.m_i - (pQVar5->crect).y1.m_i) + 1;
            uVar12 = (uint)((ulong)uVar9 >> 0x20);
            if ((int)uVar13 <= (int)uVar12) {
              uVar12 = uVar13;
            }
            QVar11 = qSmartMinSize(this_01);
            uVar14 = (ulong)QVar11 >> 0x20;
            uVar19 = (ulong)uVar18;
            if ((int)uVar18 <= QVar11.wd.m_i.m_i) {
              uVar19 = (ulong)QVar11 & 0xffffffff;
            }
            if (QVar11.ht.m_i.m_i < (int)uVar12) {
              uVar14 = (ulong)uVar12;
            }
            local_58 = (QSize)(uVar19 | uVar14 << 0x20);
            QWidget::resize(this_01,&local_58);
          }
          bVar7 = QWidget::testAttribute_helper(this_01,WA_Moved);
          if (((!bVar7) && (bVar7 = QWidget::isMinimized(this_01), !bVar7)) &&
             (bVar7 = QWidget::isMaximized(this_01), !bVar7)) {
            QMdiAreaPrivate::place(this_00,this_00->placer,(QMdiSubWindow *)this_01);
          }
        }
      }
      pQVar15 = pQVar15 + 1;
    } while (pQVar15 != pQVar16);
  }
  else {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (lVar1 != 0) goto LAB_00442e16;
  }
  QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
LAB_00442f7a:
  QMdiAreaPrivate::setChildActivationEnabled(this_00,true,false);
  QMdiAreaPrivate::activateCurrentWindow(this_00);
  QWidget::showEvent((QWidget *)this,showEvent);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiArea::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiArea);
    if (!d->pendingRearrangements.isEmpty()) {
        bool skipPlacement = false;
        // Take a copy because d->rearrange() may modify d->pendingRearrangements
        const auto pendingRearrange = d->pendingRearrangements;
        for (Rearranger *rearranger : pendingRearrange) {
            // If this is the case, we don't have to lay out pending child windows
            // since the rearranger will find a placement for them.
            if (rearranger->type() != Rearranger::IconTiler && !skipPlacement)
                skipPlacement = true;
            d->rearrange(rearranger);
        }
        d->pendingRearrangements.clear();

        if (skipPlacement && !d->pendingPlacements.isEmpty())
            d->pendingPlacements.clear();
    }

    if (!d->pendingPlacements.isEmpty()) {
        // Nothing obvious in the loop body changes the container (in this code path)
        // during iteration, this is calling into a non-const method that does change
        // the container when called from other places. So take a copy anyway for good
        // measure.
        const auto copy = d->pendingPlacements;
        for (QMdiSubWindow *window : copy) {
            if (!window)
                continue;
            if (d->viewMode == TabbedView && window->d_func()->isActive && !d->active) {
                d->showActiveWindowMaximized = true;
                d->emitWindowActivated(window); // Also maximizes the window
                continue;
            }
            if (!window->testAttribute(Qt::WA_Resized)) {
                QSize newSize(window->sizeHint().boundedTo(viewport()->size()));
                window->resize(newSize.expandedTo(qSmartMinSize(window)));
            }
            if (!window->testAttribute(Qt::WA_Moved) && !window->isMinimized()
                    && !window->isMaximized()) {
                d->place(d->placer, window);
            }
        }
        d->pendingPlacements.clear();
    }

    d->setChildActivationEnabled(true);
    d->activateCurrentWindow();

    QAbstractScrollArea::showEvent(showEvent);
}